

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
          (SmallVectorImpl<llvm::StringRef> *this,char **Args)

{
  void *pvVar1;
  char *__s;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  
  uVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity <= uVar2
     ) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,0);
    uVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  lVar3 = (ulong)uVar2 * 0x10;
  __s = *Args;
  *(char **)((long)pvVar1 + lVar3) = __s;
  if (__s == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(__s);
  }
  *(size_t *)((long)pvVar1 + lVar3 + 8) = sVar4;
  SmallVectorBase::set_size((SmallVectorBase *)this,(ulong)uVar2 + 1);
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }